

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O1

void printBuffer(InputBuffer *buf)

{
  long *plVar1;
  istream is;
  undefined1 local_1a0 [72];
  locale local_158 [16];
  shared_count local_148 [6];
  undefined8 local_118 [12];
  undefined8 auStack_b8 [21];
  
  avro::istream::istream((istream *)local_1a0,buf);
  plVar1 = (long *)std::ostream::operator<<
                             (&std::cout,
                              *(streambuf **)
                               ((long)auStack_b8 + (long)*(_func_int **)(local_1a0._0_8_ + -0x18)));
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  local_1a0._0_8_ = avro::istream::vtable + 0x18;
  local_118[0] = 0x1dc698;
  local_1a0._16_8_ = &PTR__istreambuf_001dc720;
  boost::detail::shared_count::~shared_count(local_148);
  local_1a0._16_8_ = sysconf;
  std::locale::~locale(local_158);
  local_1a0._0_8_ = std::istream-in-avro::istream::construction_vtable + 0x18;
  local_118[0] = 0x1dc6e8;
  local_1a0._8_8_ = 0;
  std::ios_base::~ios_base((ios_base *)local_118);
  return;
}

Assistant:

void printBuffer(const InputBuffer &buf) 
{
    avro::istream is(buf);
    cout << is.rdbuf() << endl;
}